

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O1

bool __thiscall CCNR::ls_solver::build_instance(ls_solver *this,string *inst)

{
  pointer *pplVar1;
  pointer this_00;
  uint uVar2;
  pointer pcVar3;
  pointer plVar4;
  iterator iVar5;
  uint uVar6;
  size_t sVar7;
  iterator iVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  istream *piVar12;
  bool bVar13;
  uint *puVar14;
  pointer plVar15;
  vector<int,_std::allocator<int>_> *__range4;
  uint *puVar16;
  ulong uVar17;
  int cur_lit;
  lit item;
  string line;
  string tempstr2;
  string tempstr1;
  istringstream iss;
  ifstream fin;
  uint *local_468;
  iterator iStack_460;
  int *local_458;
  ls_solver *local_450;
  uint local_444;
  ulong local_440;
  lit local_438;
  undefined1 local_428 [16];
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408 [16];
  undefined1 *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8 [16];
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  long local_3b8 [2];
  string local_3a8 [104];
  ios_base local_340 [264];
  long local_238 [65];
  
  local_418 = local_408;
  local_410 = 0;
  local_408[0] = 0;
  std::__cxx11::istringstream::istringstream((istringstream *)local_3b8);
  local_3d8 = local_3c8;
  local_3d0 = 0;
  local_3c8[0] = 0;
  local_3f8 = local_3e8;
  local_3f0 = 0;
  local_3e8[0] = 0;
  local_458 = (int *)0x0;
  local_468 = (uint *)0x0;
  iStack_460._M_current = (int *)0x0;
  std::ifstream::ifstream((istream *)local_238,(inst->_M_dataplus)._M_p,_S_in);
  cVar9 = std::__basic_file<char>::is_open();
  if (cVar9 != '\0') {
    do {
      do {
        cVar9 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)local_238,(string *)&local_418,cVar9);
        if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) goto LAB_0012c767;
        std::__cxx11::string::substr((ulong)&local_438,(ulong)&local_418);
        iVar11 = std::__cxx11::string::compare((char *)&local_438);
        if ((undefined1 *)local_438._0_8_ != local_428) {
          operator_delete((void *)local_438._0_8_);
        }
      } while (iVar11 == 0);
      std::__cxx11::string::substr((ulong)&local_438,(ulong)&local_418);
      iVar11 = std::__cxx11::string::compare((char *)&local_438);
      if ((undefined1 *)local_438._0_8_ != local_428) {
        operator_delete((void *)local_438._0_8_);
      }
    } while (iVar11 != 0);
    std::ios::clear((int)local_3b8 + (int)*(undefined8 *)(local_3b8[0] + -0x18));
    std::__cxx11::stringbuf::str(local_3a8);
    std::istream::seekg((long)local_3b8,_S_beg);
    piVar12 = std::operator>>((istream *)local_3b8,(string *)&local_3d8);
    piVar12 = std::operator>>(piVar12,(string *)&local_3f8);
    piVar12 = std::istream::_M_extract<unsigned_long>((ulong *)piVar12);
    std::istream::_M_extract<unsigned_long>((ulong *)piVar12);
LAB_0012c767:
    bVar10 = make_space(this);
    if (bVar10) {
      local_450 = this;
      if (this->_num_clauses != 0) {
        uVar17 = 0;
        do {
          puVar16 = local_468;
          local_468 = (uint *)0x0;
          iStack_460._M_current = (int *)0x0;
          local_458 = (int *)0x0;
          if (puVar16 != (uint *)0x0) {
            operator_delete(puVar16);
          }
          std::istream::operator>>((istream *)local_238,(int *)&local_444);
          bVar10 = false;
          while (iVar8._M_current = iStack_460._M_current, puVar16 = local_468, local_444 != 0) {
            if (!bVar10) {
              if (local_468 == (uint *)iStack_460._M_current) {
                bVar13 = false;
              }
              else {
                while( true ) {
                  puVar14 = puVar16 + 1;
                  uVar2 = *puVar16;
                  bVar13 = true;
                  if (local_444 != -uVar2) {
                    bVar13 = bVar10;
                  }
                  if (local_444 == uVar2) {
                    bVar13 = bVar10;
                  }
                  bVar10 = bVar13;
                  bVar13 = false;
                  if (local_444 == uVar2) break;
                  if ((local_444 == -uVar2) ||
                     (puVar16 = puVar14, puVar14 == (uint *)iStack_460._M_current))
                  goto LAB_0012c838;
                }
                bVar13 = true;
              }
LAB_0012c838:
              if (!bVar13) {
                if (iStack_460._M_current == local_458) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_468,iStack_460,
                             (int *)&local_444);
                }
                else {
                  *iStack_460._M_current = local_444;
                  iStack_460._M_current = iStack_460._M_current + 1;
                }
              }
            }
            std::istream::operator>>((istream *)local_238,(int *)&local_444);
          }
          if (bVar10) {
            this->_num_clauses = this->_num_clauses - 1;
            local_468 = (uint *)0x0;
            iStack_460._M_current = (int *)0x0;
            local_458 = (int *)0x0;
            if (puVar16 != (uint *)0x0) {
              operator_delete(puVar16);
            }
          }
          else {
            local_440 = uVar17;
            if (local_468 != (uint *)iStack_460._M_current) {
              do {
                uVar2 = *puVar16;
                pcVar3 = (local_450->_clauses).
                         super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar17;
                uVar6 = -uVar2;
                if (0 < (int)uVar2) {
                  uVar6 = uVar2;
                }
                local_438.var_num = (size_t)uVar6;
                local_438._0_4_ = (uint)(0 < (int)uVar2) | (int)uVar17 * 2;
                iVar5._M_current =
                     (pcVar3->literals).super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (pcVar3->literals).super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::_M_realloc_insert<CCNR::lit>
                            (&pcVar3->literals,iVar5,&local_438);
                }
                else {
                  *(undefined8 *)iVar5._M_current = local_438._0_8_;
                  (iVar5._M_current)->var_num = local_438.var_num;
                  pplVar1 = &(pcVar3->literals).
                             super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                  *pplVar1 = *pplVar1 + 1;
                }
                puVar16 = puVar16 + 1;
              } while (puVar16 != (uint *)iVar8._M_current);
            }
            uVar17 = local_440 + 1;
            this = local_450;
          }
        } while (uVar17 < this->_num_clauses);
      }
      std::ifstream::close();
      if (this->_num_clauses != 0) {
        uVar17 = 0;
        do {
          pcVar3 = (this->_clauses).super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          plVar4 = *(pointer *)
                    ((long)&pcVar3[uVar17].literals.
                            super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
          for (plVar15 = *(pointer *)
                          &pcVar3[uVar17].literals.
                           super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl;
              plVar15 != plVar4; plVar15 = plVar15 + 1) {
            local_438._0_8_ = *(undefined8 *)plVar15;
            local_438.var_num = plVar15->var_num;
            this_00 = (local_450->_vars).
                      super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>._M_impl.
                      super__Vector_impl_data._M_start + local_438.var_num;
            iVar5._M_current =
                 *(pointer *)
                  ((long)&(this_00->literals).
                          super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
            if (iVar5._M_current ==
                *(pointer *)
                 ((long)&(this_00->literals).
                         super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 0x10))
            {
              std::vector<CCNR::lit,std::allocator<CCNR::lit>>::_M_realloc_insert<CCNR::lit_const&>
                        ((vector<CCNR::lit,std::allocator<CCNR::lit>> *)this_00,iVar5,&local_438);
            }
            else {
              sVar7 = plVar15->var_num;
              *(undefined8 *)iVar5._M_current = *(undefined8 *)plVar15;
              (iVar5._M_current)->var_num = sVar7;
              pplVar1 = (pointer *)
                        ((long)&(this_00->literals).
                                super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                        8);
              *pplVar1 = *pplVar1 + 1;
            }
          }
          uVar17 = uVar17 + 1;
          this = local_450;
        } while (uVar17 < local_450->_num_clauses);
      }
      bVar10 = true;
      build_neighborhood(this);
      goto LAB_0012c9cf;
    }
  }
  bVar10 = false;
LAB_0012c9cf:
  std::ifstream::~ifstream(local_238);
  if (local_468 != (uint *)0x0) {
    operator_delete(local_468);
  }
  if (local_3f8 != local_3e8) {
    operator_delete(local_3f8);
  }
  if (local_3d8 != local_3c8) {
    operator_delete(local_3d8);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
  std::ios_base::~ios_base(local_340);
  if (local_418 != local_408) {
    operator_delete(local_418);
  }
  return bVar10;
}

Assistant:

bool ls_solver::build_instance(string inst)
{
    string line;
    istringstream iss;
    size_t c, v;
    int cur_lit;
    bool lit_redundent, clause_tautology;
    string tempstr1, tempstr2;
    vector<int> temp_clause;
    ifstream fin(inst.c_str());
    if (!fin.is_open()) return false;
    while (getline(fin, line)) {
        if (line.substr(0, 1) == "c")
            continue;
        else if (line.substr(0, 1) == "p") {
            // reassign_istringstream(iss, line);
            iss.clear();
            iss.str(line);
            iss.seekg(0, ios::beg);
            iss >> tempstr1 >> tempstr2 >> _num_vars >> _num_clauses;
            break;
        }
    }
    if (!make_space()) return false;
    // read clauses, each at a time
    for (c = 0; c < _num_clauses;) {
        clause_tautology = false;
        temp_clause.clear();
        vector<int>().swap(temp_clause);
        fin >> cur_lit;
        while (cur_lit != 0) {
            if (!clause_tautology) {
                lit_redundent = false;
                for (int item : temp_clause) {
                    if (cur_lit == item) {
                        lit_redundent = true;
                        break;
                    } else if (cur_lit == -item) {
                        clause_tautology = true;
                        break;
                    }
                }
                if (!lit_redundent) {
                    temp_clause.push_back(cur_lit);
                }
            }
            fin >> cur_lit;
        }
        if (!clause_tautology) {
            for (int item : temp_clause) {
                _clauses[c].literals.push_back(lit(item, c));
            }
            c++;
        } else {
            _num_clauses--;
            temp_clause.clear();
            vector<int>().swap(temp_clause);
        }
    }
    fin.close();
    /********finish reading the input file****************/
    // build variables data structure
    for (c = 0; c < _num_clauses; c++) {
        for (lit item : _clauses[c].literals) {
            v = item.var_num;
            _vars[v].literals.push_back(item);
        }
    }
    build_neighborhood();
    return true;
}